

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edge_detection.cpp
# Opt level: O1

void anon_unknown.dwarf_8edeb::getEdgePoints<double>
               (vector<double,_std::allocator<double>_> *edge,
               vector<int,_std::allocator<int>_> *data,vector<int,_std::allocator<int>_> *first,
               vector<int,_std::allocator<int>_> *second,EdgeParameter *edgeParameter)

{
  bool checkContrast;
  int iVar1;
  int iVar2;
  pointer piVar3;
  bool bVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  uint32_t size;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t leftSideOffset;
  ulong uVar11;
  int minimumContrast;
  uint uVar12;
  ulong uVar13;
  uint32_t position;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint local_84;
  uint32_t local_80;
  ulong local_58;
  
  size = (uint32_t)
         ((ulong)((long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(data->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
  if (1 < size - 2) {
    minimumContrast = (uint)edgeParameter->minimumContrast * edgeParameter->groupFactor;
    checkContrast =
         edgeParameter->contrastCheckLeftSideOffset != 0 &&
         edgeParameter->contrastCheckRightSideOffset != 0;
    uVar14 = 1;
    uVar16 = 2;
    uVar17 = 3;
    do {
      uVar15 = (ulong)uVar16;
      piVar3 = (second->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((-1 < piVar3[uVar14]) && (piVar3[uVar14 + 1] < 1)) {
        piVar3 = (first->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar12 = piVar3[uVar14 + 1];
        if (piVar3[uVar14 + 1] < piVar3[uVar14]) {
          uVar12 = piVar3[uVar14];
        }
        if (0 < (int)uVar12) {
          uVar13 = uVar14 + 1;
          uVar8 = uVar12 / 3;
          if ((int)uVar12 < 3) {
            uVar8 = 1;
          }
          uVar9 = uVar12 >> 1;
          if (uVar12 == 1) {
            uVar9 = 1;
          }
          bVar7 = false;
          position = (uint32_t)uVar14;
          uVar11 = uVar14 & 0xffffffff;
          local_80 = position;
          while( true ) {
            uVar10 = (uint32_t)uVar11;
            if ((!bVar7) && (piVar3[uVar11] < (int)uVar9)) {
              bVar7 = true;
              local_80 = uVar10;
            }
            iVar1 = piVar3[uVar11];
            leftSideOffset = uVar10;
            if (iVar1 < (int)uVar8) break;
            uVar11 = (ulong)(uVar10 - 1);
            leftSideOffset = position;
            if (((int)uVar12 < iVar1) || (uVar10 == 0)) break;
          }
          if ((iVar1 < (int)uVar8) || (bVar7)) {
            if (uVar13 < size - 1) {
              bVar6 = false;
              local_84 = (uint)uVar13;
              uVar5 = uVar17;
              do {
                if ((!bVar6) && (piVar3[uVar15] < (int)uVar9)) {
                  bVar6 = true;
                  local_84 = (uint)uVar15;
                }
                iVar2 = piVar3[uVar15];
                bVar4 = (int)uVar8 <= iVar2;
                local_58 = uVar15;
                if ((iVar2 < (int)uVar8) || (local_58 = uVar13, (int)uVar12 < iVar2)) break;
                uVar15 = uVar15 + 1;
                bVar18 = uVar5 < size - 1;
                uVar5 = uVar5 + 1;
              } while (bVar18);
              uVar13 = (ulong)local_84;
            }
            else {
              bVar6 = false;
              bVar4 = true;
              local_58 = uVar13;
            }
            if ((bVar7) && (bVar6)) {
              bVar7 = findPoint<double>(data,second,edge,local_80,(uint32_t)uVar13,minimumContrast,
                                        checkContrast,edgeParameter->contrastCheckLeftSideOffset,
                                        edgeParameter->contrastCheckRightSideOffset,position,size);
              bVar7 = bVar7 || (int)uVar8 <= iVar1;
            }
            else {
              bVar7 = (int)uVar8 <= iVar1;
            }
            if (!bVar4 && !bVar7) {
              findPoint<double>(data,second,edge,leftSideOffset,(uint32_t)local_58,minimumContrast,
                                checkContrast,edgeParameter->contrastCheckLeftSideOffset,
                                edgeParameter->contrastCheckRightSideOffset,position,size);
            }
          }
        }
      }
      uVar14 = uVar14 + 1;
      uVar16 = uVar16 + 1;
      uVar17 = uVar17 + 1;
    } while (uVar14 != size - 2);
  }
  return;
}

Assistant:

void getEdgePoints( std::vector < _Type > & edge, const std::vector < int > & data, const std::vector < int > & first, const std::vector < int > & second, const EdgeParameter & edgeParameter )
    {
        const uint32_t dataSize = static_cast<uint32_t>(data.size()); // we know that initial size is uint32_t
        const int minimumContrast = static_cast<int>(edgeParameter.minimumContrast * edgeParameter.groupFactor);

        const bool checkContrast = (edgeParameter.contrastCheckLeftSideOffset > 0u) && (edgeParameter.contrastCheckRightSideOffset > 0u);

        for ( uint32_t i = 1u; i < dataSize - 2u; i++ ) {
            if ( second[i] < 0 || second[i + 1] > 0 )
                continue;

            const int maxGradient = (first[i] > first[i + 1]) ? first[i] : first[i + 1];

            if ( maxGradient <= 0 )
                continue;

            const int minGradientValue = (maxGradient < 3) ? 1 : maxGradient / 3;
            const int halfGradient     = (maxGradient < 2) ? 1 : maxGradient / 2;

            // left side
            bool normalGradientleftEdgeFound  = false;
            bool minimumGradientLeftEdgeFound = false;

            uint32_t normalLeftSide  = i;
            uint32_t minimumLeftSide = i;

            for ( uint32_t j = i; ; --j ) {
                if ( !normalGradientleftEdgeFound && first[j] < halfGradient ) {
                    normalLeftSide = j;
                    normalGradientleftEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumLeftSide = j;
                    minimumGradientLeftEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;

                if ( j == 0u ) // this is to avoid out of bounds situation
                    break;
            }

            if ( !normalGradientleftEdgeFound && !minimumGradientLeftEdgeFound )
                continue;

            // right side
            bool normalGradientRightEdgeFound  = false;
            bool minimumGradientRightEdgeFound = false;

            uint32_t normalRightSide  = i + 1u;
            uint32_t minimumRightSide = i + 1u;

            for ( uint32_t j = i + 1u; j < dataSize - 1u; ++j ) {
                if ( !normalGradientRightEdgeFound && first[j] < halfGradient ) {
                    normalRightSide = j;
                    normalGradientRightEdgeFound = true;
                }

                if ( first[j] < minGradientValue ) {
                    minimumRightSide = j;
                    minimumGradientRightEdgeFound = true;
                    break;
                }

                if ( first[j] > maxGradient )
                    break;
            }

            bool edgeFound = false;

            if ( normalGradientleftEdgeFound && normalGradientRightEdgeFound ) {
                edgeFound = findPoint( data, second, edge, normalLeftSide, normalRightSide, minimumContrast, checkContrast,
                                       edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                                       i, dataSize );
            }

            if ( !edgeFound && minimumGradientLeftEdgeFound && minimumGradientRightEdgeFound ) {
                findPoint( data, second, edge, minimumLeftSide, minimumRightSide, minimumContrast, checkContrast,
                           edgeParameter.contrastCheckLeftSideOffset, edgeParameter.contrastCheckRightSideOffset,
                           i, dataSize );
            }
        }
    }